

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompletionProvider.cpp
# Opt level: O0

void addMagicCommentCompletions(CompletionList *completions,File *file,PrefixData *prefix)

{
  File *pFVar1;
  ostream *poVar2;
  Range *pRVar3;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  string local_40;
  PrefixData *local_20;
  PrefixData *prefix_local;
  File *file_local;
  CompletionList *completions_local;
  
  local_20 = prefix;
  prefix_local = (PrefixData *)file;
  file_local = (File *)completions;
  poVar2 = std::operator<<((ostream *)&std::cerr,"command so far: ");
  poVar2 = std::operator<<(poVar2,(string *)&local_20->value);
  std::operator<<(poVar2,"\n");
  pFVar1 = file_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"!root",&local_41);
  getRootForFile_abi_cxx11_(&local_98,(File *)prefix_local);
  std::operator+(&local_78,"% !TEX root = ",&local_98);
  pRVar3 = &local_20->range;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
  CompletionList::addSnippet((CompletionList *)pFVar1,&local_40,&local_78,pRVar3,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pFVar1 = file_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"!engine",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"% !TEX engine = ${0:pdflatex}",&local_109);
  pRVar3 = &local_20->range;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"",&local_131);
  CompletionList::addSnippet((CompletionList *)pFVar1,&local_e0,&local_108,pRVar3,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  poVar2 = std::operator<<((ostream *)&std::cerr,"R:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(local_20->range).start.column);
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(local_20->range).end.column);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void addMagicCommentCompletions (CompletionList &completions, File &file, PrefixData &prefix) {
    std::cerr << "command so far: " << prefix.value << "\n";

    completions.addSnippet("!root", "% !TEX root = " + getRootForFile(file), prefix.range);
    completions.addSnippet("!engine", "% !TEX engine = ${0:pdflatex}", prefix.range);

    std::cerr << "R:" << prefix.range.start.column << ":" << prefix.range.end.column << "\n";
}